

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::FillScopeObject
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
              Var *paramAddr,PropertyIdArray *propIds,HeapArgumentsObject *argsObj,
              ScriptContext *scriptContext,bool nonSimpleParamList,bool useCachedScope)

{
  code *pcVar1;
  bool bVar2;
  int oldCount;
  int newCount;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptGeneratorFunction *this;
  GeneratorVirtualScriptFunction *this_00;
  FunctionBody *pFVar5;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  Var pvVar8;
  JavascriptLibrary *this_01;
  RecyclableObject *value;
  ES5HeapArgumentsObject *pEVar9;
  Type local_d4;
  Type local_c4;
  bool local_79;
  int newSlotCapacity;
  int oldSlotCapacity;
  bool skipLetAttrForArguments;
  DynamicType *newType;
  DynamicObject *frameObject;
  Var *tmpAddr;
  uint32 i;
  bool useCachedScope_local;
  bool nonSimpleParamList_local;
  PropertyIdArray *propIds_local;
  Var *paramAddr_local;
  Var frameObj_local;
  uint32 formalsCount_local;
  uint32 actualsCount_local;
  JavascriptFunction *funcCallee_local;
  
  if ((formalsCount != 0) && (frameObj == (Var)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1d31,"(formalsCount == 0 || frameObj != nullptr)",
                                "formalsCount == 0 || frameObj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (formalsCount != 0) {
    if (useCachedScope) {
      newType = (DynamicType *)VarTo<Js::DynamicObject>(frameObj);
    }
    else {
      if (nonSimpleParamList) {
        bVar2 = VarIs<Js::JavascriptGeneratorFunction,Js::JavascriptFunction>(funcCallee);
        if (bVar2) {
          this = UnsafeVarTo<Js::JavascriptGeneratorFunction,Js::JavascriptFunction>(funcCallee);
          this_00 = JavascriptGeneratorFunction::GetGeneratorVirtualScriptFunction(this);
          pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
          local_79 = FunctionBody::HasReferenceableBuiltInArguments(pFVar5);
        }
        else {
          pFVar5 = JavascriptFunction::GetFunctionBody(funcCallee);
          local_79 = FunctionBody::HasReferenceableBuiltInArguments(pFVar5);
        }
        if (local_79 == false) {
          pDVar6 = DynamicObject::GetDynamicType((DynamicObject *)frameObj);
          _oldSlotCapacity =
               PathTypeHandlerBase::CreateNewScopeObject<false>
                         (scriptContext,pDVar6,propIds,'G',0xffffffff);
        }
        else {
          pDVar6 = DynamicObject::GetDynamicType((DynamicObject *)frameObj);
          _oldSlotCapacity =
               PathTypeHandlerBase::CreateNewScopeObject<true>
                         (scriptContext,pDVar6,propIds,'G',0xffffffff);
        }
      }
      else {
        pDVar6 = DynamicObject::GetDynamicType((DynamicObject *)frameObj);
        _oldSlotCapacity =
             PathTypeHandlerBase::CreateNewScopeObject<false>
                       (scriptContext,pDVar6,propIds,'\0',0xffffffff);
      }
      pDVar6 = DynamicObject::GetDynamicType((DynamicObject *)frameObj);
      pDVar7 = DynamicType::GetTypeHandler(pDVar6);
      oldCount = DynamicTypeHandler::GetSlotCapacity(pDVar7);
      pDVar7 = DynamicType::GetTypeHandler(_oldSlotCapacity);
      newCount = DynamicTypeHandler::GetSlotCapacity(pDVar7);
      pDVar7 = DynamicType::GetTypeHandler(_oldSlotCapacity);
      DynamicObject::EnsureSlots((DynamicObject *)frameObj,oldCount,newCount,scriptContext,pDVar7);
      DynamicObject::ReplaceType((DynamicObject *)frameObj,_oldSlotCapacity);
      newType = (DynamicType *)frameObj;
    }
    if ((argsObj != (HeapArgumentsObject *)0x0) && (nonSimpleParamList)) {
      pvVar8 = ConvertToUnmappedArguments
                         (argsObj,actualsCount,paramAddr,(DynamicObject *)newType,propIds,
                          formalsCount,scriptContext);
      return pvVar8;
    }
    frameObject = (DynamicObject *)paramAddr;
    for (tmpAddr._0_4_ = 0; (uint32)tmpAddr < formalsCount && (uint32)tmpAddr < actualsCount;
        tmpAddr._0_4_ = (uint32)tmpAddr + 1) {
      if (propIds == (PropertyIdArray *)0x0) {
        local_c4 = 0xffffffff;
      }
      else {
        local_c4 = (&propIds[1].count)[(uint32)tmpAddr];
      }
      DynamicObject::SetSlot
                ((DynamicObject *)newType,local_c4,false,(uint32)tmpAddr,
                 (frameObject->super_RecyclableObject).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject);
      frameObject = (DynamicObject *)&(frameObject->super_RecyclableObject).type;
    }
    if ((uint32)tmpAddr < formalsCount) {
      for (; (uint32)tmpAddr < formalsCount; tmpAddr._0_4_ = (uint32)tmpAddr + 1) {
        if (propIds == (PropertyIdArray *)0x0) {
          local_d4 = 0xffffffff;
        }
        else {
          local_d4 = (&propIds[1].count)[(uint32)tmpAddr];
        }
        this_01 = ScriptContext::GetLibrary(scriptContext);
        value = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
        DynamicObject::SetSlot((DynamicObject *)newType,local_d4,false,(uint32)tmpAddr,value);
      }
    }
  }
  if (argsObj != (HeapArgumentsObject *)0x0) {
    frameObject = (DynamicObject *)(paramAddr + formalsCount);
    for (tmpAddr._0_4_ = formalsCount; (uint32)tmpAddr < actualsCount;
        tmpAddr._0_4_ = (uint32)tmpAddr + 1) {
      SetItem(argsObj,(RecyclableObject *)argsObj,(uint32)tmpAddr,
              (frameObject->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject,scriptContext,
              PropertyOperation_None,1);
      frameObject = (DynamicObject *)&(frameObject->super_RecyclableObject).type;
    }
    BVar3 = JavascriptFunction::IsStrictMode(funcCallee);
    if (BVar3 != 0) {
      pEVar9 = HeapArgumentsObject::ConvertToUnmappedArgumentsObject
                         (argsObj,(bool)((nonSimpleParamList ^ 0xffU) & 1));
      return pEVar9;
    }
  }
  return argsObj;
}

Assistant:

Var JavascriptOperators::FillScopeObject(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, Var * paramAddr,
        Js::PropertyIdArray *propIds, HeapArgumentsObject * argsObj, ScriptContext * scriptContext, bool nonSimpleParamList, bool useCachedScope)
    {
        Assert(formalsCount == 0 || frameObj != nullptr);

        // Transfer formal arguments (that were actually passed) from their ArgIn slots to the local frame object.
        uint32 i;

        Var *tmpAddr = paramAddr;

        if (formalsCount != 0)
        {
            DynamicObject* frameObject = nullptr;
            if (useCachedScope)
            {
                frameObject = VarTo<DynamicObject>(frameObj);
                __analysis_assume((uint32)frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity() >= formalsCount);
            }
            else
            {
                frameObject = (DynamicObject*)frameObj;
                // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
                // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
                // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
                // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
                // is ready for storing values directly to slots.
                DynamicType* newType = nullptr;
                if (nonSimpleParamList)
                {
                    bool skipLetAttrForArguments = ( VarIs<JavascriptGeneratorFunction>(funcCallee) ?
                        UnsafeVarTo<JavascriptGeneratorFunction>(funcCallee)->GetGeneratorVirtualScriptFunction()->GetFunctionBody()->HasReferenceableBuiltInArguments()
                        : funcCallee->GetFunctionBody()->HasReferenceableBuiltInArguments());

                    if (skipLetAttrForArguments)
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                    else
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                }
                else
                {
                    newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds);
                }
                int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
                int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();
                __analysis_assume((uint32)newSlotCapacity >= formalsCount);

                frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
                frameObject->ReplaceType(newType);
            }

            if (argsObj && nonSimpleParamList)
            {
                return ConvertToUnmappedArguments(argsObj, actualsCount, paramAddr, frameObject, propIds, formalsCount, scriptContext);
            }

            for (i = 0; i < formalsCount && i < actualsCount; i++, tmpAddr++)
            {
                frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, *tmpAddr));
            }

            if (i < formalsCount)
            {
                // The formals that weren't passed still need to be put in the frame object so that
                // their names will be found. Initialize them to "undefined".
                for (; i < formalsCount; i++)
                {
                    frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, scriptContext->GetLibrary()->GetUndefined()));
                }
            }
        }

        if (argsObj != nullptr)
        {
            // Transfer the unnamed actual arguments, if any, to the Arguments object itself.
            for (i = formalsCount, tmpAddr = paramAddr + i; i < actualsCount; i++, tmpAddr++)
            {
                // ES5 10.6.11: use [[DefineOwnProperty]] semantics (instead of [[Put]]):
                // do not check whether property is non-writable/etc in the prototype.
                // ES3 semantics is same.
                JavascriptOperators::SetItem(argsObj, argsObj, i, *tmpAddr, scriptContext, PropertyOperation_None, /* skipPrototypeCheck = */ TRUE);
            }

            if (funcCallee->IsStrictMode())
            {
                // If the formals are let decls, then we just overwrote the frame object slots with
                // Undecl sentinels, and we can use the original arguments that were passed to the HeapArgumentsObject.
                return argsObj->ConvertToUnmappedArgumentsObject(!nonSimpleParamList);
            }
        }
        return argsObj;
    }